

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

float fasttanh(float p)

{
  float fVar1;
  
  fVar1 = fastexp(0.0);
  return 2.0 / (fVar1 + 1.0) + -1.0;
}

Assistant:

static inline float fasttanh(float p) { return -1.0f + 2.0f / (1.0f + fastexp(-2.0f * p)); }